

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void idx2::Init<unsigned_long,idx2::brick_volume>
               (hash_table<unsigned_long,_idx2::brick_volume> *Ht,i64 LogCapacityIn,
               allocator *AllocIn)

{
  long Size;
  bucket_status *__s;
  size_t __n;
  
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  __n = 1L << ((byte)LogCapacityIn & 0x3f);
  Size = __n + 1;
  AllocPtr<unsigned_long>(&Ht->Keys,Size,AllocIn);
  AllocPtr<idx2::brick_volume>(&Ht->Vals,Size,AllocIn);
  AllocPtr<idx2::hash_table<unsigned_long,idx2::brick_volume>::bucket_status>
            (&Ht->Stats,Size,AllocIn);
  __s = Ht->Stats;
  memset(__s,0,__n);
  __s[__n] = Occupied;
  return;
}

Assistant:

void
Init(hash_table<k, v>* Ht, i64 LogCapacityIn, allocator* AllocIn = &Mallocator())
{
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  i64 Capacity = 1ll << LogCapacityIn;
  AllocPtr(&Ht->Keys, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Vals, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Stats, Capacity + 1, AllocIn);
  Fill(Ht->Stats, Ht->Stats + Capacity, hash_table<k, v>::Empty);
  Ht->Stats[Capacity] = hash_table<k, v>::Occupied; // sentinel
}